

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadMultiTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  XML *this_00;
  undefined8 uVar2;
  SharedState *pSVar3;
  _Alloc_hider __nptr;
  int iVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  undefined8 extraout_RAX;
  MultiTransformNode *pMVar9;
  GroupNode *this_01;
  pointer pTVar10;
  runtime_error *this_02;
  long *plVar11;
  undefined8 uVar12;
  uint uVar13;
  size_t *psVar14;
  long *in_RDX;
  ulong uVar15;
  size_t size;
  long lVar16;
  char *this_03;
  pointer pcVar17;
  string str_time_steps;
  undefined1 local_d0 [32];
  undefined1 local_b0 [40];
  XMLLoader *local_88;
  SharedState *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_b0._0_8_ = local_b0 + 0x10;
  local_b0._32_8_ = this;
  local_88 = (XMLLoader *)xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"time_steps","");
  XML::parm(&local_70,this_00,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_70);
  __nptr._M_p = local_70._M_dataplus._M_p;
  if (iVar4 == 0) {
    uVar13 = 1;
LAB_0018f8fd:
    local_78 = (pointer)(ulong)uVar13;
    size = (long)local_78 << 5;
    local_b0._8_8_ = (pointer)0x0;
    local_b0._16_8_ = 0;
    local_b0._24_8_ = 0;
    local_b0._24_8_ = alignedMalloc(size,8);
    sVar8 = 0;
    do {
      puVar1 = (undefined8 *)(local_b0._24_8_ + sVar8 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(local_b0._24_8_ + sVar8 + 0x18) = 0;
      sVar8 = sVar8 + 0x20;
    } while (size != sVar8);
    local_b0._8_8_ = local_78;
    local_b0._16_8_ = local_78;
    lVar7 = (long)local_78 * 8;
    lVar16 = 0;
    local_80 = (SharedState *)0x0;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(*(long *)(*(long *)(*in_RDX + 0x80) + lVar16) + 0x30));
      if (iVar4 == 0) {
        loadAffineSpace3faArray
                  ((avector<AffineSpace3ff> *)local_d0,local_88,
                   (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar16));
        uVar2 = local_b0._24_8_;
        alignedFree(*(void **)(local_b0._24_8_ + 0x18 + lVar16 * 4));
        uVar12 = local_d0._8_8_;
        puVar1 = (undefined8 *)(uVar2 + 8 + lVar16 * 4);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)(uVar2 + 0x18 + lVar16 * 4) = 0;
        local_d0._8_8_ = 0;
        psVar14 = (size_t *)(uVar2 + 8 + lVar16 * 4);
        *psVar14 = uVar12;
        psVar14[1] = local_d0._16_8_;
        local_d0._16_8_ = 0;
        *(undefined8 *)(uVar2 + 0x18 + lVar16 * 4) = local_d0._24_8_;
        local_d0._24_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        alignedFree((void *)0x0);
      }
      else {
        this_03 = "QuaternionArray";
        iVar4 = std::__cxx11::string::compare
                          ((char *)(*(long *)(*(long *)(*in_RDX + 0x80) + lVar16) + 0x30));
        if (iVar4 != 0) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d0._0_8_ = *plVar11;
          psVar14 = (size_t *)(plVar11 + 2);
          if ((size_t *)local_d0._0_8_ == psVar14) {
            local_d0._16_8_ = *psVar14;
            local_d0._24_8_ = plVar11[3];
            local_d0._0_8_ = local_d0 + 0x10;
          }
          else {
            local_d0._16_8_ = *psVar14;
          }
          local_d0._8_8_ = plVar11[1];
          *plVar11 = (long)psVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::runtime_error::runtime_error(this_02,(string *)local_d0);
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        loadQuaternionArray((avector<AffineSpace3ff> *)local_d0,(XMLLoader *)this_03,
                            (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar16));
        uVar2 = local_b0._24_8_;
        alignedFree(*(void **)(local_b0._24_8_ + 0x18 + lVar16 * 4));
        uVar12 = local_d0._8_8_;
        puVar1 = (undefined8 *)(uVar2 + 8 + lVar16 * 4);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)(uVar2 + 0x18 + lVar16 * 4) = 0;
        local_d0._8_8_ = 0;
        psVar14 = (size_t *)(uVar2 + 8 + lVar16 * 4);
        *psVar14 = uVar12;
        psVar14[1] = local_d0._16_8_;
        local_d0._16_8_ = 0;
        *(undefined8 *)(uVar2 + 0x18 + lVar16 * 4) = local_d0._24_8_;
        local_d0._24_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        alignedFree((void *)0x0);
        local_80 = (SharedState *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      pcVar17 = local_78;
      local_d0._24_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      local_d0._16_8_ = 0;
      local_d0._8_8_ = 0;
      lVar16 = lVar16 + 8;
    } while (lVar7 - lVar16 != 0);
    if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3 == (ulong)((int)local_78 + 1)) {
      pMVar9 = (MultiTransformNode *)alignedMalloc(0x88,0x10);
      loadNode((XMLLoader *)local_d0,(Ref<embree::XML> *)local_88);
      SceneGraph::MultiTransformNode::MultiTransformNode
                (pMVar9,(avector<avector<AffineSpace3ff>_> *)local_b0,
                 (Ref<embree::SceneGraph::Node> *)local_d0);
      pSVar3 = local_80;
      if ((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) {
        (**(code **)(*(long *)local_d0._0_8_ + 0x18))();
      }
      pTVar10 = (pMVar9->spaces).
                super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar9->spaces).
          super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar10) {
        lVar7 = 0x28;
        uVar15 = 0;
        do {
          *(byte *)((long)&(pTVar10->time_range).lower + lVar7) = (byte)pSVar3 & 1;
          uVar15 = uVar15 + 1;
          pTVar10 = (pMVar9->spaces).
                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x30;
        } while (uVar15 < (ulong)(((long)(pMVar9->spaces).
                                         super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10
                                  >> 4) * -0x5555555555555555));
      }
      *(MultiTransformNode **)local_b0._32_8_ = pMVar9;
      (*(pMVar9->super_Node).super_RefCount._vptr_RefCount[2])(pMVar9);
    }
    else {
      this_01 = (GroupNode *)operator_new(0x80);
      SceneGraph::GroupNode::GroupNode(this_01,0);
      (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
      if (pcVar17 < (pointer)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3)) {
        do {
          loadNode((XMLLoader *)local_d0,(Ref<embree::XML> *)local_88);
          if ((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) {
            std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::push_back(&this_01->children,(value_type *)local_d0);
          }
          if ((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) {
            (**(code **)(*(long *)local_d0._0_8_ + 0x18))();
          }
          pcVar17 = pcVar17 + 1;
        } while (pcVar17 < (pointer)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
      }
      pMVar9 = (MultiTransformNode *)alignedMalloc(0x88,0x10);
      local_d0._0_8_ = this_01;
      (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
      pSVar3 = local_80;
      SceneGraph::MultiTransformNode::MultiTransformNode
                (pMVar9,(avector<avector<AffineSpace3ff>_> *)local_b0,
                 (Ref<embree::SceneGraph::Node> *)local_d0);
      if ((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) {
        (**(code **)(*(long *)local_d0._0_8_ + 0x18))();
      }
      pTVar10 = (pMVar9->spaces).
                super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar9->spaces).
          super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar10) {
        lVar7 = 0x28;
        uVar15 = 0;
        do {
          *(byte *)((long)&(pTVar10->time_range).lower + lVar7) = (byte)pSVar3 & 1;
          uVar15 = uVar15 + 1;
          pTVar10 = (pMVar9->spaces).
                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x30;
        } while (uVar15 < (ulong)(((long)(pMVar9->spaces).
                                         super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10
                                  >> 4) * -0x5555555555555555));
      }
      *(MultiTransformNode **)local_b0._32_8_ = pMVar9;
      (*(pMVar9->super_Node).super_RefCount._vptr_RefCount[2])(pMVar9);
      (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
    }
    if ((pointer)local_b0._8_8_ != (pointer)0x0) {
      lVar7 = 0x18;
      pcVar17 = (pointer)0x0;
      do {
        uVar12 = local_b0._24_8_;
        alignedFree(*(void **)(local_b0._24_8_ + lVar7));
        pcVar17 = pcVar17 + 1;
        puVar1 = (undefined8 *)(uVar12 + -0x10 + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)(uVar12 + lVar7) = 0;
        lVar7 = lVar7 + 0x20;
      } while (pcVar17 < (ulong)local_b0._8_8_);
    }
    alignedFree((void *)local_b0._24_8_);
    local_b0._8_8_ = (pointer)0x0;
    local_b0._16_8_ = 0;
    local_b0._24_8_ = 0;
    alignedFree((void *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)local_b0._32_8_;
  }
  piVar6 = __errno_location();
  iVar4 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol(__nptr._M_p,(char **)local_b0,10);
  if ((pointer)local_b0._0_8_ == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar5 = (uint)lVar7;
    if (((int)uVar5 == lVar7) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      uVar13 = 1;
      if (1 < (int)uVar5) {
        uVar13 = uVar5;
      }
      goto LAB_0018f8fd;
    }
  }
  uVar12 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar12);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadMultiTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    avector<AffineSpace3ff> space;
    avector<avector<AffineSpace3ff>> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      if (xml->children[i]->name == "AffineSpaceArray") {
        spaces[j++] = loadAffineSpace3faArray(xml->children[i]);
      }
      else if (xml->children[i]->name == "QuaternionArray") {
        spaces[j++] = loadQuaternionArray(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);

    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::MultiTransformNode(spaces,loadNode(xml->children[time_steps]));
      for (size_t i = 0; i < node->spaces.size(); ++i) {
        node->spaces[i].quaternion = quaternion;
      }
      return node;
    }

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));

    auto node = new  SceneGraph::MultiTransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    for (size_t i = 0; i < node->spaces.size(); ++i) {
      node->spaces[i].quaternion = quaternion;
    }
    return node;
  }